

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O3

Var Js::JavascriptMath::MulSubRight
              (Var mulLeft,Var mulRight,Var subRight,ScriptContext *scriptContext,
              JavascriptNumber *result)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint64 uVar4;
  Var pvVar5;
  double dVar6;
  JavascriptNumber value;
  double dVar7;
  JavascriptNumber local_58;
  JavascriptNumber mulTemp;
  
  if (((ulong)mulLeft & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)mulLeft & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00a9fd04;
    *puVar3 = 0;
LAB_00a9f7cb:
    if (((ulong)mulRight & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)mulRight & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)mulRight & 0xffff000000000000) != 0x1000000000000) {
        if ((ulong)mulRight >> 0x32 == 0) goto LAB_00a9fb7a;
        dVar7 = (double)(int)mulLeft;
        dVar6 = (double)((ulong)mulRight ^ 0xfffc000000000000);
        goto LAB_00a9fa03;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00a9fd04;
      *puVar3 = 0;
    }
    bVar2 = NumberUtilities::IsNan(0.0);
    if (bVar2) {
      uVar4 = NumberUtilities::ToSpecial(0.0);
      if (uVar4 != 0xfff8000000000000) {
        uVar4 = NumberUtilities::ToSpecial(0.0);
        if (uVar4 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0x11,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar2) goto LAB_00a9fd04;
          *puVar3 = 0;
        }
      }
    }
    uVar4 = NumberUtilities::ToSpecial(0.0);
    local_58.m_value = (double)(uVar4 ^ 0xfffc000000000000);
    pvVar5 = TaggedInt::MultiplyInPlace(mulLeft,mulRight,scriptContext,&local_58);
LAB_00a9fc45:
    if (result == (JavascriptNumber *)0x0) {
      pvVar5 = Subtract_Full(pvVar5,subRight,scriptContext);
    }
    else {
      pvVar5 = Subtract_InPlace(pvVar5,subRight,scriptContext,result);
    }
    return pvVar5;
  }
  if (((ulong)mulLeft & 0xffff000000000000) == 0x1000000000000) goto LAB_00a9f7cb;
  if (((ulong)mulRight & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)mulRight & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)mulRight & 0xffff000000000000) == 0x1000000000000) goto LAB_00a9f9dc;
    if ((ulong)mulRight >> 0x32 != 0 && (ulong)mulLeft >> 0x32 != 0) {
      value.m_value =
           (double)((ulong)mulRight ^ 0xfffc000000000000) *
           (double)((ulong)mulLeft ^ 0xfffc000000000000);
      if (((ulong)subRight & 0x1ffff00000000) == 0x1000000000000 ||
          ((ulong)subRight & 0xffff000000000000) != 0x1000000000000) {
        if (((ulong)subRight & 0xffff000000000000) != 0x1000000000000) {
          if (subRight < (Var)0x4000000000000) {
            pvVar5 = JavascriptNumber::ToVarMaybeInPlace(value.m_value,scriptContext,result);
            goto LAB_00a9fca8;
          }
          dVar6 = (double)((ulong)subRight ^ 0xfffc000000000000);
          goto LAB_00a9fa9b;
        }
      }
      else {
        AssertCount = AssertCount + 1;
        mulTemp.m_value = value.m_value;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar2) goto LAB_00a9fd04;
        *puVar3 = 0;
        value = mulTemp;
      }
      dVar6 = (double)(int)subRight;
      goto LAB_00a9fa9b;
    }
LAB_00a9fb7a:
    bVar2 = NumberUtilities::IsNan(0.0);
    if (bVar2) {
      uVar4 = NumberUtilities::ToSpecial(0.0);
      if (uVar4 != 0xfff8000000000000) {
        uVar4 = NumberUtilities::ToSpecial(0.0);
        if (uVar4 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0x11,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar2) goto LAB_00a9fd04;
          *puVar3 = 0;
        }
      }
    }
    uVar4 = NumberUtilities::ToSpecial(0.0);
    local_58.m_value = (double)(uVar4 ^ 0xfffc000000000000);
    pvVar5 = Multiply_InPlace(mulLeft,mulRight,scriptContext,&local_58);
    goto LAB_00a9fc45;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                              ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                              "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
  if (!bVar2) goto LAB_00a9fd04;
  *puVar3 = 0;
LAB_00a9f9dc:
  if ((ulong)mulLeft >> 0x32 == 0) goto LAB_00a9fb7a;
  dVar7 = (double)((ulong)mulLeft ^ 0xfffc000000000000);
  dVar6 = (double)(int)mulRight;
LAB_00a9fa03:
  value.m_value = dVar6 * dVar7;
  if (((ulong)subRight & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)subRight & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)subRight & 0xffff000000000000) != 0x1000000000000) {
      if (subRight < (Var)0x4000000000000) {
        pvVar5 = JavascriptNumber::ToVarMaybeInPlace(value.m_value,scriptContext,result);
LAB_00a9fca8:
        pvVar5 = Subtract_Full(pvVar5,subRight,scriptContext);
        return pvVar5;
      }
      dVar6 = (double)((ulong)subRight ^ 0xfffc000000000000);
      goto LAB_00a9fa9b;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    mulTemp.m_value = value.m_value;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
LAB_00a9fd04:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    value = mulTemp;
  }
  dVar6 = (double)(int)subRight;
LAB_00a9fa9b:
  pvVar5 = JavascriptNumber::ToVarMaybeInPlace(value.m_value - dVar6,scriptContext,result);
  return pvVar5;
}

Assistant:

Var JavascriptMath::MulSubRight(Var mulLeft, Var mulRight, Var subRight, ScriptContext* scriptContext, JavascriptNumber* result)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_MulSubRight);
            if(TaggedInt::Is(mulLeft))
            {
                if(TaggedInt::Is(mulRight))
                {
                    // Compute the sum using integer addition, then convert to double.
                    // That way there's only one int->float conversion.
                    JavascriptNumber mulTemp(0, scriptContext->GetLibrary()->GetNumberTypeStatic());
                    Var mulResult = TaggedInt::MultiplyInPlace(mulLeft, mulRight, scriptContext, &mulTemp);

                    if (result)
                    {
                        return JavascriptMath::Subtract_InPlace(mulResult, subRight, scriptContext, result);
                    }
                    else
                    {
                        return JavascriptMath::Subtract_Full(mulResult, subRight, scriptContext);
                    }
                }
                else if(JavascriptNumber::Is_NoTaggedIntCheck(mulRight))
                {
                    double mulResult = TaggedInt::ToDouble(mulLeft) * JavascriptNumber::GetValue(mulRight);

                    return JavascriptMath::Subtract_DoubleHelper(mulResult, subRight, scriptContext, result);
                }
            }
            else if(TaggedInt::Is(mulRight))
            {
                if(JavascriptNumber::Is_NoTaggedIntCheck(mulLeft))
                {
                    double mulResult = JavascriptNumber::GetValue(mulLeft) * TaggedInt::ToDouble(mulRight);

                    return JavascriptMath::Subtract_DoubleHelper(mulResult, subRight, scriptContext, result);
                }
            }
            else if(JavascriptNumber::Is_NoTaggedIntCheck(mulLeft) && JavascriptNumber::Is_NoTaggedIntCheck(mulRight))
            {
                double mulResult = JavascriptNumber::GetValue(mulLeft) * JavascriptNumber::GetValue(mulRight);

                return JavascriptMath::Subtract_DoubleHelper(mulResult, subRight, scriptContext, result);
            }

            Var aMul;
            JavascriptNumber mulTemp(0, scriptContext->GetLibrary()->GetNumberTypeStatic());
            aMul = JavascriptMath::Multiply_InPlace(mulLeft, mulRight, scriptContext, &mulTemp);
            if (result)
            {
                return JavascriptMath::Subtract_InPlace(aMul, subRight, scriptContext, result);
            }
            else
            {
                return JavascriptMath::Subtract_Full(aMul, subRight, scriptContext);
            }
            JIT_HELPER_END(Op_MulSubRight);
        }